

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteBuiltin_db_rollback(jx9_context *pCtx,int argc,jx9_value **argv)

{
  int iVar1;
  long *plVar2;
  int rc;
  unqlite *pDb;
  unqlite_vm *pVm;
  jx9_value **argv_local;
  int argc_local;
  jx9_context *pCtx_local;
  
  plVar2 = (long *)jx9_context_user_data(pCtx);
  iVar1 = unqlitePagerRollback(*(Pager **)(*plVar2 + 0xd8),1);
  jx9_result_bool(pCtx,(uint)(iVar1 == 0));
  return 0;
}

Assistant:

static int unqliteBuiltin_db_rollback(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_vm *pVm;
	unqlite *pDb;
	int rc;
	SXUNUSED(argc); /* cc warning */
	SXUNUSED(argv);
	/* Point to the unqlite Vm */
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Point to the underlying database handle  */
	pDb = pVm->pDb;
	/* Rollback the transaction if any */
	rc = unqlitePagerRollback(pDb->sDB.pPager,TRUE);
	/* Rollback result */
	jx9_result_bool(pCtx,rc == UNQLITE_OK );
	return JX9_OK;
}